

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

bool __thiscall MockNamedValue::equals(MockNamedValue *this,MockNamedValue *p)

{
  bool bVar1;
  int iVar2;
  SimpleString *pSVar3;
  bool local_a79;
  bool local_a51;
  bool local_a3b;
  bool local_a29;
  bool local_a13;
  bool local_a01;
  bool local_9d9;
  bool local_9b1;
  bool local_99b;
  bool local_989;
  bool local_973;
  bool local_961;
  bool local_94b;
  bool local_939;
  bool local_923;
  bool local_911;
  bool local_8fb;
  bool local_8e9;
  bool local_8d3;
  bool local_8c1;
  bool local_8ab;
  bool local_899;
  bool local_883;
  bool local_871;
  bool local_849;
  bool local_821;
  bool local_7f9;
  bool local_7d1;
  bool local_7bb;
  bool local_7a9;
  bool local_793;
  bool local_781;
  bool local_759;
  bool local_731;
  bool local_71b;
  bool local_709;
  bool local_6f3;
  bool local_6e1;
  bool local_6cb;
  bool local_6b9;
  bool local_6a3;
  bool local_691;
  bool local_67b;
  bool local_669;
  bool local_653;
  bool local_641;
  bool local_619;
  bool local_5f1;
  SimpleString local_5d0;
  SimpleString local_5c0;
  SimpleString local_5b0;
  SimpleString local_5a0;
  SimpleString local_590;
  SimpleString local_580;
  SimpleString local_570;
  SimpleString local_560;
  SimpleString local_550;
  SimpleString local_540;
  SimpleString local_530;
  SimpleString local_520;
  SimpleString local_510;
  SimpleString local_500;
  SimpleString local_4f0;
  byte local_4d9;
  SimpleString local_4d8;
  SimpleString local_4c8;
  byte local_4b1;
  SimpleString local_4b0;
  SimpleString local_4a0;
  byte local_489;
  SimpleString local_488;
  SimpleString local_478;
  byte local_461;
  SimpleString local_460;
  SimpleString local_450;
  byte local_439;
  SimpleString local_438;
  SimpleString local_428;
  byte local_411;
  SimpleString local_410;
  SimpleString local_400;
  byte local_3e9;
  SimpleString local_3e8;
  SimpleString local_3d8;
  byte local_3c1;
  SimpleString local_3c0;
  SimpleString local_3b0;
  byte local_399;
  SimpleString local_398;
  SimpleString local_388;
  byte local_371;
  SimpleString local_370;
  SimpleString local_360;
  byte local_349;
  SimpleString local_348;
  SimpleString local_338;
  byte local_321;
  SimpleString local_320;
  SimpleString local_310;
  byte local_2f9;
  SimpleString local_2f8;
  SimpleString local_2e8;
  byte local_2d1;
  SimpleString local_2d0;
  SimpleString local_2c0;
  byte local_2a9;
  SimpleString local_2a8;
  SimpleString local_298;
  byte local_281;
  SimpleString local_280;
  SimpleString local_270;
  byte local_259;
  SimpleString local_258;
  SimpleString local_248;
  byte local_231;
  SimpleString local_230;
  SimpleString local_220;
  byte local_209;
  SimpleString local_208;
  SimpleString local_1f8;
  byte local_1e1;
  SimpleString local_1e0;
  SimpleString local_1d0;
  byte local_1b9;
  SimpleString local_1b8;
  SimpleString local_1a8;
  byte local_191;
  SimpleString local_190;
  SimpleString local_180;
  byte local_169;
  SimpleString local_168;
  SimpleString local_158;
  byte local_141;
  SimpleString local_140;
  SimpleString local_130;
  byte local_119;
  SimpleString local_118;
  SimpleString local_108;
  byte local_f1;
  SimpleString local_f0;
  SimpleString local_e0;
  byte local_c9;
  SimpleString local_c8;
  SimpleString local_b8;
  byte local_a1;
  SimpleString local_a0;
  SimpleString local_90;
  byte local_79;
  SimpleString local_78;
  SimpleString local_68;
  byte local_51;
  SimpleString local_50 [2];
  SimpleString local_30;
  MockNamedValue *local_20;
  MockNamedValue *p_local;
  MockNamedValue *this_local;
  
  local_20 = p;
  p_local = this;
  SimpleString::SimpleString(&local_30,"long int");
  local_51 = 0;
  bVar1 = operator==(&this->type_,&local_30);
  local_5f1 = false;
  if (bVar1) {
    pSVar3 = &local_20->type_;
    SimpleString::SimpleString(local_50,"int");
    local_51 = 1;
    local_5f1 = operator==(pSVar3,local_50);
  }
  if ((local_51 & 1) != 0) {
    SimpleString::~SimpleString(local_50);
  }
  SimpleString::~SimpleString(&local_30);
  if (local_5f1 == false) {
    SimpleString::SimpleString(&local_68,"int");
    local_79 = 0;
    bVar1 = operator==(&this->type_,&local_68);
    local_619 = false;
    if (bVar1) {
      pSVar3 = &local_20->type_;
      SimpleString::SimpleString(&local_78,"long int");
      local_79 = 1;
      local_619 = operator==(pSVar3,&local_78);
    }
    if ((local_79 & 1) != 0) {
      SimpleString::~SimpleString(&local_78);
    }
    SimpleString::~SimpleString(&local_68);
    if (local_619 == false) {
      SimpleString::SimpleString(&local_90,"unsigned int");
      local_a1 = 0;
      bVar1 = operator==(&this->type_,&local_90);
      local_641 = false;
      if (bVar1) {
        pSVar3 = &local_20->type_;
        SimpleString::SimpleString(&local_a0,"int");
        local_a1 = 1;
        local_641 = operator==(pSVar3,&local_a0);
      }
      if ((local_a1 & 1) != 0) {
        SimpleString::~SimpleString(&local_a0);
      }
      SimpleString::~SimpleString(&local_90);
      if (local_641 == false) {
        SimpleString::SimpleString(&local_b8,"int");
        local_c9 = 0;
        bVar1 = operator==(&this->type_,&local_b8);
        local_669 = false;
        if (bVar1) {
          pSVar3 = &local_20->type_;
          SimpleString::SimpleString(&local_c8,"unsigned int");
          local_c9 = 1;
          local_669 = operator==(pSVar3,&local_c8);
        }
        if ((local_c9 & 1) != 0) {
          SimpleString::~SimpleString(&local_c8);
        }
        SimpleString::~SimpleString(&local_b8);
        if (local_669 == false) {
          SimpleString::SimpleString(&local_e0,"unsigned long int");
          local_f1 = 0;
          bVar1 = operator==(&this->type_,&local_e0);
          local_691 = false;
          if (bVar1) {
            pSVar3 = &local_20->type_;
            SimpleString::SimpleString(&local_f0,"int");
            local_f1 = 1;
            local_691 = operator==(pSVar3,&local_f0);
          }
          if ((local_f1 & 1) != 0) {
            SimpleString::~SimpleString(&local_f0);
          }
          SimpleString::~SimpleString(&local_e0);
          if (local_691 == false) {
            SimpleString::SimpleString(&local_108,"int");
            local_119 = 0;
            bVar1 = operator==(&this->type_,&local_108);
            local_6b9 = false;
            if (bVar1) {
              pSVar3 = &local_20->type_;
              SimpleString::SimpleString(&local_118,"unsigned long int");
              local_119 = 1;
              local_6b9 = operator==(pSVar3,&local_118);
            }
            if ((local_119 & 1) != 0) {
              SimpleString::~SimpleString(&local_118);
            }
            SimpleString::~SimpleString(&local_108);
            if (local_6b9 == false) {
              SimpleString::SimpleString(&local_130,"unsigned int");
              local_141 = 0;
              bVar1 = operator==(&this->type_,&local_130);
              local_6e1 = false;
              if (bVar1) {
                pSVar3 = &local_20->type_;
                SimpleString::SimpleString(&local_140,"long int");
                local_141 = 1;
                local_6e1 = operator==(pSVar3,&local_140);
              }
              if ((local_141 & 1) != 0) {
                SimpleString::~SimpleString(&local_140);
              }
              SimpleString::~SimpleString(&local_130);
              if (local_6e1 == false) {
                SimpleString::SimpleString(&local_158,"long int");
                local_169 = 0;
                bVar1 = operator==(&this->type_,&local_158);
                local_709 = false;
                if (bVar1) {
                  pSVar3 = &local_20->type_;
                  SimpleString::SimpleString(&local_168,"unsigned int");
                  local_169 = 1;
                  local_709 = operator==(pSVar3,&local_168);
                }
                if ((local_169 & 1) != 0) {
                  SimpleString::~SimpleString(&local_168);
                }
                SimpleString::~SimpleString(&local_158);
                if (local_709 == false) {
                  SimpleString::SimpleString(&local_180,"unsigned int");
                  local_191 = 0;
                  bVar1 = operator==(&this->type_,&local_180);
                  local_731 = false;
                  if (bVar1) {
                    pSVar3 = &local_20->type_;
                    SimpleString::SimpleString(&local_190,"unsigned long int");
                    local_191 = 1;
                    local_731 = operator==(pSVar3,&local_190);
                  }
                  if ((local_191 & 1) != 0) {
                    SimpleString::~SimpleString(&local_190);
                  }
                  SimpleString::~SimpleString(&local_180);
                  if (local_731 == false) {
                    SimpleString::SimpleString(&local_1a8,"unsigned long int");
                    local_1b9 = 0;
                    bVar1 = operator==(&this->type_,&local_1a8);
                    local_759 = false;
                    if (bVar1) {
                      pSVar3 = &local_20->type_;
                      SimpleString::SimpleString(&local_1b8,"unsigned int");
                      local_1b9 = 1;
                      local_759 = operator==(pSVar3,&local_1b8);
                    }
                    if ((local_1b9 & 1) != 0) {
                      SimpleString::~SimpleString(&local_1b8);
                    }
                    SimpleString::~SimpleString(&local_1a8);
                    if (local_759 == false) {
                      SimpleString::SimpleString(&local_1d0,"long int");
                      local_1e1 = 0;
                      bVar1 = operator==(&this->type_,&local_1d0);
                      local_781 = false;
                      if (bVar1) {
                        pSVar3 = &local_20->type_;
                        SimpleString::SimpleString(&local_1e0,"unsigned long int");
                        local_1e1 = 1;
                        local_781 = operator==(pSVar3,&local_1e0);
                      }
                      if ((local_1e1 & 1) != 0) {
                        SimpleString::~SimpleString(&local_1e0);
                      }
                      SimpleString::~SimpleString(&local_1d0);
                      if (local_781 == false) {
                        SimpleString::SimpleString(&local_1f8,"unsigned long int");
                        local_209 = 0;
                        bVar1 = operator==(&this->type_,&local_1f8);
                        local_7a9 = false;
                        if (bVar1) {
                          pSVar3 = &local_20->type_;
                          SimpleString::SimpleString(&local_208,"long int");
                          local_209 = 1;
                          local_7a9 = operator==(pSVar3,&local_208);
                        }
                        if ((local_209 & 1) != 0) {
                          SimpleString::~SimpleString(&local_208);
                        }
                        SimpleString::~SimpleString(&local_1f8);
                        if (local_7a9 == false) {
                          SimpleString::SimpleString(&local_220,"long long int");
                          local_231 = 0;
                          bVar1 = operator==(&this->type_,&local_220);
                          local_7d1 = false;
                          if (bVar1) {
                            pSVar3 = &local_20->type_;
                            SimpleString::SimpleString(&local_230,"int");
                            local_231 = 1;
                            local_7d1 = operator==(pSVar3,&local_230);
                          }
                          if ((local_231 & 1) != 0) {
                            SimpleString::~SimpleString(&local_230);
                          }
                          SimpleString::~SimpleString(&local_220);
                          if (local_7d1 == false) {
                            SimpleString::SimpleString(&local_248,"int");
                            local_259 = 0;
                            bVar1 = operator==(&this->type_,&local_248);
                            local_7f9 = false;
                            if (bVar1) {
                              pSVar3 = &local_20->type_;
                              SimpleString::SimpleString(&local_258,"long long int");
                              local_259 = 1;
                              local_7f9 = operator==(pSVar3,&local_258);
                            }
                            if ((local_259 & 1) != 0) {
                              SimpleString::~SimpleString(&local_258);
                            }
                            SimpleString::~SimpleString(&local_248);
                            if (local_7f9 == false) {
                              SimpleString::SimpleString(&local_270,"long long int");
                              local_281 = 0;
                              bVar1 = operator==(&this->type_,&local_270);
                              local_821 = false;
                              if (bVar1) {
                                pSVar3 = &local_20->type_;
                                SimpleString::SimpleString(&local_280,"long int");
                                local_281 = 1;
                                local_821 = operator==(pSVar3,&local_280);
                              }
                              if ((local_281 & 1) != 0) {
                                SimpleString::~SimpleString(&local_280);
                              }
                              SimpleString::~SimpleString(&local_270);
                              if (local_821 == false) {
                                SimpleString::SimpleString(&local_298,"long int");
                                local_2a9 = 0;
                                bVar1 = operator==(&this->type_,&local_298);
                                local_849 = false;
                                if (bVar1) {
                                  pSVar3 = &local_20->type_;
                                  SimpleString::SimpleString(&local_2a8,"long long int");
                                  local_2a9 = 1;
                                  local_849 = operator==(pSVar3,&local_2a8);
                                }
                                if ((local_2a9 & 1) != 0) {
                                  SimpleString::~SimpleString(&local_2a8);
                                }
                                SimpleString::~SimpleString(&local_298);
                                if (local_849 == false) {
                                  SimpleString::SimpleString(&local_2c0,"long long int");
                                  local_2d1 = 0;
                                  bVar1 = operator==(&this->type_,&local_2c0);
                                  local_871 = false;
                                  if (bVar1) {
                                    pSVar3 = &local_20->type_;
                                    SimpleString::SimpleString(&local_2d0,"unsigned int");
                                    local_2d1 = 1;
                                    local_871 = operator==(pSVar3,&local_2d0);
                                  }
                                  if ((local_2d1 & 1) != 0) {
                                    SimpleString::~SimpleString(&local_2d0);
                                  }
                                  SimpleString::~SimpleString(&local_2c0);
                                  if (local_871 == false) {
                                    SimpleString::SimpleString(&local_2e8,"unsigned int");
                                    local_2f9 = 0;
                                    bVar1 = operator==(&this->type_,&local_2e8);
                                    local_899 = false;
                                    if (bVar1) {
                                      pSVar3 = &local_20->type_;
                                      SimpleString::SimpleString(&local_2f8,"long long int");
                                      local_2f9 = 1;
                                      local_899 = operator==(pSVar3,&local_2f8);
                                    }
                                    if ((local_2f9 & 1) != 0) {
                                      SimpleString::~SimpleString(&local_2f8);
                                    }
                                    SimpleString::~SimpleString(&local_2e8);
                                    if (local_899 == false) {
                                      SimpleString::SimpleString(&local_310,"long long int");
                                      local_321 = 0;
                                      bVar1 = operator==(&this->type_,&local_310);
                                      local_8c1 = false;
                                      if (bVar1) {
                                        pSVar3 = &local_20->type_;
                                        SimpleString::SimpleString(&local_320,"unsigned long int");
                                        local_321 = 1;
                                        local_8c1 = operator==(pSVar3,&local_320);
                                      }
                                      if ((local_321 & 1) != 0) {
                                        SimpleString::~SimpleString(&local_320);
                                      }
                                      SimpleString::~SimpleString(&local_310);
                                      if (local_8c1 == false) {
                                        SimpleString::SimpleString(&local_338,"unsigned long int");
                                        local_349 = 0;
                                        bVar1 = operator==(&this->type_,&local_338);
                                        local_8e9 = false;
                                        if (bVar1) {
                                          pSVar3 = &local_20->type_;
                                          SimpleString::SimpleString(&local_348,"long long int");
                                          local_349 = 1;
                                          local_8e9 = operator==(pSVar3,&local_348);
                                        }
                                        if ((local_349 & 1) != 0) {
                                          SimpleString::~SimpleString(&local_348);
                                        }
                                        SimpleString::~SimpleString(&local_338);
                                        if (local_8e9 == false) {
                                          SimpleString::SimpleString(&local_360,"long long int");
                                          local_371 = 0;
                                          bVar1 = operator==(&this->type_,&local_360);
                                          local_911 = false;
                                          if (bVar1) {
                                            pSVar3 = &local_20->type_;
                                            SimpleString::SimpleString
                                                      (&local_370,"unsigned long long int");
                                            local_371 = 1;
                                            local_911 = operator==(pSVar3,&local_370);
                                          }
                                          if ((local_371 & 1) != 0) {
                                            SimpleString::~SimpleString(&local_370);
                                          }
                                          SimpleString::~SimpleString(&local_360);
                                          if (local_911 == false) {
                                            SimpleString::SimpleString
                                                      (&local_388,"unsigned long long int");
                                            local_399 = 0;
                                            bVar1 = operator==(&this->type_,&local_388);
                                            local_939 = false;
                                            if (bVar1) {
                                              pSVar3 = &local_20->type_;
                                              SimpleString::SimpleString(&local_398,"long long int")
                                              ;
                                              local_399 = 1;
                                              local_939 = operator==(pSVar3,&local_398);
                                            }
                                            if ((local_399 & 1) != 0) {
                                              SimpleString::~SimpleString(&local_398);
                                            }
                                            SimpleString::~SimpleString(&local_388);
                                            if (local_939 == false) {
                                              SimpleString::SimpleString
                                                        (&local_3b0,"unsigned long long int");
                                              local_3c1 = 0;
                                              bVar1 = operator==(&this->type_,&local_3b0);
                                              local_961 = false;
                                              if (bVar1) {
                                                pSVar3 = &local_20->type_;
                                                SimpleString::SimpleString(&local_3c0,"int");
                                                local_3c1 = 1;
                                                local_961 = operator==(pSVar3,&local_3c0);
                                              }
                                              if ((local_3c1 & 1) != 0) {
                                                SimpleString::~SimpleString(&local_3c0);
                                              }
                                              SimpleString::~SimpleString(&local_3b0);
                                              if (local_961 == false) {
                                                SimpleString::SimpleString(&local_3d8,"int");
                                                local_3e9 = 0;
                                                bVar1 = operator==(&this->type_,&local_3d8);
                                                local_989 = false;
                                                if (bVar1) {
                                                  pSVar3 = &local_20->type_;
                                                  SimpleString::SimpleString
                                                            (&local_3e8,"unsigned long long int");
                                                  local_3e9 = 1;
                                                  local_989 = operator==(pSVar3,&local_3e8);
                                                }
                                                if ((local_3e9 & 1) != 0) {
                                                  SimpleString::~SimpleString(&local_3e8);
                                                }
                                                SimpleString::~SimpleString(&local_3d8);
                                                if (local_989 == false) {
                                                  SimpleString::SimpleString
                                                            (&local_400,"unsigned long long int");
                                                  local_411 = 0;
                                                  bVar1 = operator==(&this->type_,&local_400);
                                                  local_9b1 = false;
                                                  if (bVar1) {
                                                    pSVar3 = &local_20->type_;
                                                    SimpleString::SimpleString
                                                              (&local_410,"unsigned int");
                                                    local_411 = 1;
                                                    local_9b1 = operator==(pSVar3,&local_410);
                                                  }
                                                  if ((local_411 & 1) != 0) {
                                                    SimpleString::~SimpleString(&local_410);
                                                  }
                                                  SimpleString::~SimpleString(&local_400);
                                                  if (local_9b1 == false) {
                                                    SimpleString::SimpleString
                                                              (&local_428,"unsigned int");
                                                    local_439 = 0;
                                                    bVar1 = operator==(&this->type_,&local_428);
                                                    local_9d9 = false;
                                                    if (bVar1) {
                                                      pSVar3 = &local_20->type_;
                                                      SimpleString::SimpleString
                                                                (&local_438,"unsigned long long int"
                                                                );
                                                      local_439 = 1;
                                                      local_9d9 = operator==(pSVar3,&local_438);
                                                    }
                                                    if ((local_439 & 1) != 0) {
                                                      SimpleString::~SimpleString(&local_438);
                                                    }
                                                    SimpleString::~SimpleString(&local_428);
                                                    if (local_9d9 == false) {
                                                      SimpleString::SimpleString
                                                                (&local_450,"unsigned long long int"
                                                                );
                                                      local_461 = 0;
                                                      bVar1 = operator==(&this->type_,&local_450);
                                                      local_a01 = false;
                                                      if (bVar1) {
                                                        pSVar3 = &local_20->type_;
                                                        SimpleString::SimpleString
                                                                  (&local_460,"long int");
                                                        local_461 = 1;
                                                        local_a01 = operator==(pSVar3,&local_460);
                                                      }
                                                      if ((local_461 & 1) != 0) {
                                                        SimpleString::~SimpleString(&local_460);
                                                      }
                                                      SimpleString::~SimpleString(&local_450);
                                                      if (local_a01 == false) {
                                                        SimpleString::SimpleString
                                                                  (&local_478,"long int");
                                                        local_489 = 0;
                                                        bVar1 = operator==(&this->type_,&local_478);
                                                        local_a29 = false;
                                                        if (bVar1) {
                                                          pSVar3 = &local_20->type_;
                                                          SimpleString::SimpleString
                                                                    (&local_488,
                                                                     "unsigned long long int");
                                                          local_489 = 1;
                                                          local_a29 = operator==(pSVar3,&local_488);
                                                        }
                                                        if ((local_489 & 1) != 0) {
                                                          SimpleString::~SimpleString(&local_488);
                                                        }
                                                        SimpleString::~SimpleString(&local_478);
                                                        if (local_a29 == false) {
                                                          SimpleString::SimpleString
                                                                    (&local_4a0,
                                                                     "unsigned long long int");
                                                          local_4b1 = 0;
                                                          bVar1 = operator==(&this->type_,&local_4a0
                                                                            );
                                                          local_a51 = false;
                                                          if (bVar1) {
                                                            pSVar3 = &local_20->type_;
                                                            SimpleString::SimpleString
                                                                      (&local_4b0,
                                                                       "unsigned long int");
                                                            local_4b1 = 1;
                                                            local_a51 = operator==(pSVar3,&local_4b0
                                                                                  );
                                                          }
                                                          if ((local_4b1 & 1) != 0) {
                                                            SimpleString::~SimpleString(&local_4b0);
                                                          }
                                                          SimpleString::~SimpleString(&local_4a0);
                                                          if (local_a51 == false) {
                                                            SimpleString::SimpleString
                                                                      (&local_4c8,
                                                                       "unsigned long int");
                                                            local_4d9 = 0;
                                                            bVar1 = operator==(&this->type_,
                                                                               &local_4c8);
                                                            local_a79 = false;
                                                            if (bVar1) {
                                                              pSVar3 = &local_20->type_;
                                                              SimpleString::SimpleString
                                                                        (&local_4d8,
                                                                         "unsigned long long int");
                                                              local_4d9 = 1;
                                                              local_a79 = operator==(pSVar3,&
                                                  local_4d8);
                                                  }
                                                  if ((local_4d9 & 1) != 0) {
                                                    SimpleString::~SimpleString(&local_4d8);
                                                  }
                                                  SimpleString::~SimpleString(&local_4c8);
                                                  if (local_a79 == false) {
                                                    bVar1 = operator!=(&this->type_,&local_20->type_
                                                                      );
                                                    if (bVar1) {
                                                      this_local._7_1_ = 0;
                                                    }
                                                    else {
                                                      SimpleString::SimpleString(&local_4f0,"bool");
                                                      bVar1 = operator==(&this->type_,&local_4f0);
                                                      SimpleString::~SimpleString(&local_4f0);
                                                      if (bVar1) {
                                                        this_local._7_1_ =
                                                             ((this->value_).boolValue_ & 1U) ==
                                                             ((local_20->value_).boolValue_ & 1U);
                                                      }
                                                      else {
                                                        SimpleString::SimpleString(&local_500,"int")
                                                        ;
                                                        bVar1 = operator==(&this->type_,&local_500);
                                                        SimpleString::~SimpleString(&local_500);
                                                        if (bVar1) {
                                                          this_local._7_1_ =
                                                               (this->value_).intValue_ ==
                                                               (local_20->value_).intValue_;
                                                        }
                                                        else {
                                                          SimpleString::SimpleString
                                                                    (&local_510,"unsigned int");
                                                          bVar1 = operator==(&this->type_,&local_510
                                                                            );
                                                          SimpleString::~SimpleString(&local_510);
                                                          if (bVar1) {
                                                            this_local._7_1_ =
                                                                 (this->value_).intValue_ ==
                                                                 (local_20->value_).intValue_;
                                                          }
                                                          else {
                                                            SimpleString::SimpleString
                                                                      (&local_520,"long int");
                                                            bVar1 = operator==(&this->type_,
                                                                               &local_520);
                                                            SimpleString::~SimpleString(&local_520);
                                                            if (bVar1) {
                                                              this_local._7_1_ =
                                                                   (this->value_).longIntValue_ ==
                                                                   (local_20->value_).longIntValue_;
                                                            }
                                                            else {
                                                              SimpleString::SimpleString
                                                                        (&local_530,
                                                                         "unsigned long int");
                                                              bVar1 = operator==(&this->type_,
                                                                                 &local_530);
                                                              SimpleString::~SimpleString
                                                                        (&local_530);
                                                              if (bVar1) {
                                                                this_local._7_1_ =
                                                                     (this->value_).longIntValue_ ==
                                                                     (local_20->value_).
                                                                     longIntValue_;
                                                              }
                                                              else {
                                                                SimpleString::SimpleString
                                                                          (&local_540,
                                                                           "long long int");
                                                                bVar1 = operator==(&this->type_,
                                                                                   &local_540);
                                                                SimpleString::~SimpleString
                                                                          (&local_540);
                                                                if (bVar1) {
                                                                  this_local._7_1_ =
                                                                       (this->value_).longIntValue_
                                                                       == (local_20->value_).
                                                                          longIntValue_;
                                                                }
                                                                else {
                                                                  SimpleString::SimpleString
                                                                            (&local_550,
                                                                                                                                                          
                                                  "unsigned long long int");
                                                  bVar1 = operator==(&this->type_,&local_550);
                                                  SimpleString::~SimpleString(&local_550);
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         (this->value_).longIntValue_ ==
                                                         (local_20->value_).longIntValue_;
                                                  }
                                                  else {
                                                    SimpleString::SimpleString
                                                              (&local_560,"const char*");
                                                    bVar1 = operator==(&this->type_,&local_560);
                                                    SimpleString::~SimpleString(&local_560);
                                                    if (bVar1) {
                                                      SimpleString::SimpleString
                                                                (&local_570,
                                                                 (this->value_).stringValue_);
                                                      SimpleString::SimpleString
                                                                (&local_580,
                                                                 (local_20->value_).stringValue_);
                                                      this_local._7_1_ =
                                                           operator==(&local_570,&local_580);
                                                      SimpleString::~SimpleString(&local_580);
                                                      SimpleString::~SimpleString(&local_570);
                                                    }
                                                    else {
                                                      SimpleString::SimpleString(&local_590,"void*")
                                                      ;
                                                      bVar1 = operator==(&this->type_,&local_590);
                                                      SimpleString::~SimpleString(&local_590);
                                                      if (bVar1) {
                                                        this_local._7_1_ =
                                                             (this->value_).longIntValue_ ==
                                                             (local_20->value_).longIntValue_;
                                                      }
                                                      else {
                                                        SimpleString::SimpleString
                                                                  (&local_5a0,"const void*");
                                                        bVar1 = operator==(&this->type_,&local_5a0);
                                                        SimpleString::~SimpleString(&local_5a0);
                                                        if (bVar1) {
                                                          this_local._7_1_ =
                                                               (this->value_).longIntValue_ ==
                                                               (local_20->value_).longIntValue_;
                                                        }
                                                        else {
                                                          SimpleString::SimpleString
                                                                    (&local_5b0,"void (*)()");
                                                          bVar1 = operator==(&this->type_,&local_5b0
                                                                            );
                                                          SimpleString::~SimpleString(&local_5b0);
                                                          if (bVar1) {
                                                            this_local._7_1_ =
                                                                 (this->value_).longIntValue_ ==
                                                                 (local_20->value_).longIntValue_;
                                                          }
                                                          else {
                                                            SimpleString::SimpleString
                                                                      (&local_5c0,"double");
                                                            bVar1 = operator==(&this->type_,
                                                                               &local_5c0);
                                                            SimpleString::~SimpleString(&local_5c0);
                                                            if (bVar1) {
                                                              this_local._7_1_ =
                                                                   doubles_equal((this->value_).
                                                                                 doubleValue_.value,
                                                                                 (local_20->value_).
                                                                                 doubleValue_.value,
                                                                                 (this->value_).
                                                                                 doubleValue_.
                                                                                 tolerance);
                                                            }
                                                            else {
                                                              SimpleString::SimpleString
                                                                        (&local_5d0,
                                                                         "const unsigned char*");
                                                              bVar1 = operator==(&this->type_,
                                                                                 &local_5d0);
                                                              SimpleString::~SimpleString
                                                                        (&local_5d0);
                                                              if (bVar1) {
                                                                if (this->size_ == local_20->size_)
                                                                {
                                                                  iVar2 = SimpleString::MemCmp
                                                                                    ((this->value_).
                                                                                     pointerValue_,
                                                                                     (local_20->
                                                                                     value_).
                                                  pointerValue_,this->size_);
                                                  this_local._7_1_ = iVar2 == 0;
                                                  }
                                                  else {
                                                    this_local._7_1_ = 0;
                                                  }
                                                  }
                                                  else if (this->comparator_ ==
                                                           (MockNamedValueComparator *)0x0) {
                                                    this_local._7_1_ = 0;
                                                  }
                                                  else {
                                                    iVar2 = (*this->comparator_->
                                                              _vptr_MockNamedValueComparator[2])
                                                                      (this->comparator_,
                                                                       (this->value_).longIntValue_,
                                                                       (local_20->value_).
                                                                       longIntValue_);
                                                    this_local._7_1_ = (byte)iVar2 & 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    this_local._7_1_ =
                                                         (this->value_).longIntValue_ ==
                                                         (local_20->value_).longIntValue_;
                                                  }
                                                  }
                                                  else {
                                                    this_local._7_1_ =
                                                         (this->value_).longIntValue_ ==
                                                         (local_20->value_).longIntValue_;
                                                  }
                                                  }
                                                  else {
                                                    local_a3b = false;
                                                    if (-1 < (this->value_).longIntValue_) {
                                                      local_a3b = (this->value_).longIntValue_ ==
                                                                  (local_20->value_).longIntValue_;
                                                    }
                                                    this_local._7_1_ = local_a3b;
                                                  }
                                                  }
                                                  else {
                                                    local_a13 = false;
                                                    if (-1 < (local_20->value_).longIntValue_) {
                                                      local_a13 = (this->value_).longIntValue_ ==
                                                                  (local_20->value_).longIntValue_;
                                                    }
                                                    this_local._7_1_ = local_a13;
                                                  }
                                                  }
                                                  else {
                                                    this_local._7_1_ =
                                                         (ulong)(this->value_).unsignedIntValue_ ==
                                                         (local_20->value_).longIntValue_;
                                                  }
                                                  }
                                                  else {
                                                    this_local._7_1_ =
                                                         (this->value_).longIntValue_ ==
                                                         (ulong)(local_20->value_).unsignedIntValue_
                                                    ;
                                                  }
                                                }
                                                else {
                                                  local_99b = false;
                                                  if (-1 < (this->value_).intValue_) {
                                                    local_99b = (long)(this->value_).intValue_ ==
                                                                (local_20->value_).longIntValue_;
                                                  }
                                                  this_local._7_1_ = local_99b;
                                                }
                                              }
                                              else {
                                                local_973 = false;
                                                if (-1 < (local_20->value_).intValue_) {
                                                  local_973 = (this->value_).longIntValue_ ==
                                                              (long)(local_20->value_).intValue_;
                                                }
                                                this_local._7_1_ = local_973;
                                              }
                                            }
                                            else {
                                              local_94b = false;
                                              if (-1 < (local_20->value_).longIntValue_) {
                                                local_94b = (this->value_).longIntValue_ ==
                                                            (local_20->value_).longIntValue_;
                                              }
                                              this_local._7_1_ = local_94b;
                                            }
                                          }
                                          else {
                                            local_923 = false;
                                            if (-1 < (this->value_).longIntValue_) {
                                              local_923 = (this->value_).longIntValue_ ==
                                                          (local_20->value_).longIntValue_;
                                            }
                                            this_local._7_1_ = local_923;
                                          }
                                        }
                                        else {
                                          local_8fb = false;
                                          if (-1 < (local_20->value_).longIntValue_) {
                                            local_8fb = (this->value_).longIntValue_ ==
                                                        (local_20->value_).longIntValue_;
                                          }
                                          this_local._7_1_ = local_8fb;
                                        }
                                      }
                                      else {
                                        local_8d3 = false;
                                        if (-1 < (this->value_).longIntValue_) {
                                          local_8d3 = (this->value_).longIntValue_ ==
                                                      (local_20->value_).longIntValue_;
                                        }
                                        this_local._7_1_ = local_8d3;
                                      }
                                    }
                                    else {
                                      local_8ab = false;
                                      if (-1 < (local_20->value_).longIntValue_) {
                                        local_8ab = (ulong)(this->value_).unsignedIntValue_ ==
                                                    (local_20->value_).longIntValue_;
                                      }
                                      this_local._7_1_ = local_8ab;
                                    }
                                  }
                                  else {
                                    local_883 = false;
                                    if (-1 < (this->value_).longIntValue_) {
                                      local_883 = (this->value_).longIntValue_ ==
                                                  (ulong)(local_20->value_).unsignedIntValue_;
                                    }
                                    this_local._7_1_ = local_883;
                                  }
                                }
                                else {
                                  this_local._7_1_ =
                                       (this->value_).longIntValue_ ==
                                       (local_20->value_).longIntValue_;
                                }
                              }
                              else {
                                this_local._7_1_ =
                                     (this->value_).longIntValue_ ==
                                     (local_20->value_).longIntValue_;
                              }
                            }
                            else {
                              this_local._7_1_ =
                                   (long)(this->value_).intValue_ ==
                                   (local_20->value_).longIntValue_;
                            }
                          }
                          else {
                            this_local._7_1_ =
                                 (this->value_).longIntValue_ == (long)(local_20->value_).intValue_;
                          }
                        }
                        else {
                          local_7bb = false;
                          if (-1 < (local_20->value_).longIntValue_) {
                            local_7bb = (this->value_).longIntValue_ ==
                                        (local_20->value_).longIntValue_;
                          }
                          this_local._7_1_ = local_7bb;
                        }
                      }
                      else {
                        local_793 = false;
                        if (-1 < (this->value_).longIntValue_) {
                          local_793 = (this->value_).longIntValue_ ==
                                      (local_20->value_).longIntValue_;
                        }
                        this_local._7_1_ = local_793;
                      }
                    }
                    else {
                      this_local._7_1_ =
                           (this->value_).longIntValue_ ==
                           (ulong)(local_20->value_).unsignedIntValue_;
                    }
                  }
                  else {
                    this_local._7_1_ =
                         (ulong)(this->value_).unsignedIntValue_ == (local_20->value_).longIntValue_
                    ;
                  }
                }
                else {
                  local_71b = false;
                  if (-1 < (this->value_).longIntValue_) {
                    local_71b = (this->value_).longIntValue_ ==
                                (ulong)(local_20->value_).unsignedIntValue_;
                  }
                  this_local._7_1_ = local_71b;
                }
              }
              else {
                local_6f3 = false;
                if (-1 < (local_20->value_).longIntValue_) {
                  local_6f3 = (ulong)(this->value_).unsignedIntValue_ ==
                              (local_20->value_).longIntValue_;
                }
                this_local._7_1_ = local_6f3;
              }
            }
            else {
              local_6cb = false;
              if (-1 < (this->value_).intValue_) {
                local_6cb = (long)(this->value_).intValue_ == (local_20->value_).longIntValue_;
              }
              this_local._7_1_ = local_6cb;
            }
          }
          else {
            local_6a3 = false;
            if (-1 < (local_20->value_).intValue_) {
              local_6a3 = (this->value_).longIntValue_ == (long)(local_20->value_).intValue_;
            }
            this_local._7_1_ = local_6a3;
          }
        }
        else {
          local_67b = false;
          if (-1 < (this->value_).intValue_) {
            local_67b = (this->value_).intValue_ == (local_20->value_).intValue_;
          }
          this_local._7_1_ = local_67b;
        }
      }
      else {
        local_653 = false;
        if (-1 < (local_20->value_).intValue_) {
          local_653 = (this->value_).intValue_ == (local_20->value_).intValue_;
        }
        this_local._7_1_ = local_653;
      }
    }
    else {
      this_local._7_1_ = (long)(this->value_).intValue_ == (local_20->value_).longIntValue_;
    }
  }
  else {
    this_local._7_1_ = (this->value_).longIntValue_ == (long)(local_20->value_).intValue_;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MockNamedValue::equals(const MockNamedValue& p) const
{
    if((type_ == "long int") && (p.type_ == "int"))
        return value_.longIntValue_ == p.value_.intValue_;
    else if((type_ == "int") && (p.type_ == "long int"))
        return value_.intValue_ == p.value_.longIntValue_;
    else if((type_ == "unsigned int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned int)p.value_.intValue_);
    else if((type_ == "int") && (p.type_ == "unsigned int"))
        return (value_.intValue_ >= 0) && ((unsigned int)value_.intValue_ == p.value_.unsignedIntValue_);
    else if((type_ == "unsigned long int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long)p.value_.intValue_);
    else if((type_ == "int") && (p.type_ == "unsigned long int"))
        return (value_.intValue_ >= 0) && ((unsigned long)value_.intValue_ == p.value_.unsignedLongIntValue_);
    else if((type_ == "unsigned int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned long)p.value_.longIntValue_);
    else if((type_ == "long int") && (p.type_ == "unsigned int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long)value_.longIntValue_ == p.value_.unsignedIntValue_);
    else if((type_ == "unsigned int") && (p.type_ == "unsigned long int"))
        return value_.unsignedIntValue_ == p.value_.unsignedLongIntValue_;
    else if((type_ == "unsigned long int") && (p.type_ == "unsigned int"))
        return value_.unsignedLongIntValue_ == p.value_.unsignedIntValue_;
    else if((type_ == "long int") && (p.type_ == "unsigned long int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long)value_.longIntValue_ == p.value_.unsignedLongIntValue_);
    else if((type_ == "unsigned long int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long) p.value_.longIntValue_);
#if CPPUTEST_USE_LONG_LONG
    else if ((type_ == "long long int") && (p.type_ == "int"))
        return value_.longLongIntValue_ == p.value_.intValue_;
    else if ((type_ == "int") && (p.type_ == "long long int"))
        return value_.intValue_ == p.value_.longLongIntValue_;
    else if ((type_ == "long long int") && (p.type_ == "long int"))
        return value_.longLongIntValue_ == p.value_.longIntValue_;
    else if ((type_ == "long int") && (p.type_ == "long long int"))
        return value_.longIntValue_ == p.value_.longLongIntValue_;
    else if ((type_ == "long long int") && (p.type_ == "unsigned int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedIntValue_);
    else if ((type_ == "unsigned int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "long long int") && (p.type_ == "unsigned long int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedLongIntValue_);
    else if ((type_ == "unsigned long int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "long long int") && (p.type_ == "unsigned long long int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.intValue_);
    else if ((type_ == "int") && (p.type_ == "unsigned long long int"))
        return (value_.intValue_ >= 0) && ((unsigned long long)value_.intValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "unsigned int"))
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedIntValue_;
    else if ((type_ == "unsigned int") && (p.type_ == "unsigned long long int"))
        return value_.unsignedIntValue_ == p.value_.unsignedLongLongIntValue_;
    else if ((type_ == "unsigned long long int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.longIntValue_);
    else if ((type_ == "long int") && (p.type_ == "unsigned long long int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long long)value_.longIntValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "unsigned long int"))
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedLongIntValue_;
    else if ((type_ == "unsigned long int") && (p.type_ == "unsigned long long int"))
        return value_.unsignedLongIntValue_ == p.value_.unsignedLongLongIntValue_;
#endif

    if (type_ != p.type_) return false;

    if (type_ == "bool")
        return value_.boolValue_ == p.value_.boolValue_;
    else if (type_ == "int")
        return value_.intValue_ == p.value_.intValue_;
    else if (type_ == "unsigned int")
        return value_.unsignedIntValue_ == p.value_.unsignedIntValue_;
    else if (type_ == "long int")
        return value_.longIntValue_ == p.value_.longIntValue_;
    else if (type_ == "unsigned long int")
        return value_.unsignedLongIntValue_ == p.value_.unsignedLongIntValue_;
#if CPPUTEST_USE_LONG_LONG
    else if (type_ == "long long int")
        return value_.longLongIntValue_ == p.value_.longLongIntValue_;
    else if (type_ == "unsigned long long int")
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedLongLongIntValue_;
#endif
    else if (type_ == "const char*")
        return SimpleString(value_.stringValue_) == SimpleString(p.value_.stringValue_);
    else if (type_ == "void*")
        return value_.pointerValue_ == p.value_.pointerValue_;
    else if (type_ == "const void*")
        return value_.constPointerValue_ == p.value_.constPointerValue_;
    else if (type_ == "void (*)()")
        return value_.functionPointerValue_ == p.value_.functionPointerValue_;
    else if (type_ == "double")
        return (doubles_equal(value_.doubleValue_.value, p.value_.doubleValue_.value, value_.doubleValue_.tolerance));
    else if (type_ == "const unsigned char*")
    {
        if (size_ != p.size_) {
            return false;
        }
        return SimpleString::MemCmp(value_.memoryBufferValue_, p.value_.memoryBufferValue_, size_) == 0;
    }

    if (comparator_)
        return comparator_->isEqual(value_.constObjectPointerValue_, p.value_.constObjectPointerValue_);

    return false;
}